

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strhelper.c
# Opt level: O0

char * copy_cstring_with_length(char *str,size_t *length)

{
  size_t sVar1;
  char *new_string;
  size_t *length_local;
  char *str_local;
  
  sVar1 = strlen(str);
  *length = sVar1;
  str_local = (char *)alloc_mem(*length + 1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(str_local,str,*length);
    str_local[*length] = '\0';
  }
  return str_local;
}

Assistant:

char *
copy_cstring_with_length( const char *str, size_t *length ) {
  char *new_string;

  *length = strlen( str );

  new_string = alloc_mem( *length + 1 );
  if( !new_string ) {
    return NULL;
  }

  memcpy( new_string, str, *length );
  new_string[*length] = '\0';

  return new_string;
}